

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QByteArray * __thiscall
QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>::
convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]> *this
          )

{
  char *pcVar1;
  long size;
  long size_00;
  long in_FS_OFFSET;
  iterator d;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  size_00 = (((this->a).b)->d).size + 0x5b;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size_00,Uninitialized);
  pcVar1 = (__return_storage_ptr__->d).ptr;
  local_38 = pcVar1;
  QConcatenable<QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>_>
  ::appendTo<char>(this,&local_38);
  size = (long)local_38 - (long)pcVar1;
  if (size_00 != size) {
    QByteArray::resize(__return_storage_ptr__,size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }